

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O3

void CGL::Collada::ColladaParser::parse_light(XMLElement *xml,LightInfo *light)

{
  int iVar1;
  char *pcVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  XMLElement *pXVar6;
  XMLElement *pXVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  double dVar10;
  string color_string;
  string type;
  undefined8 uStack_410;
  undefined1 *local_408;
  long local_400;
  undefined1 local_3f8 [16];
  XMLElement *local_3e8;
  XMLElement *local_3e0;
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  string local_258;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  string local_218;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  string local_1d8;
  allocator local_1b8 [128];
  ios_base local_138 [264];
  
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  pcVar5 = (char *)(light->super_Instance).id._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&(light->super_Instance).id,0,pcVar5,(ulong)pcVar2);
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  pcVar5 = (char *)(light->super_Instance).name._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&(light->super_Instance).name,0,pcVar5,(ulong)pcVar2);
  (light->super_Instance).type = LIGHT;
  pXVar3 = get_technique_common(xml);
  pXVar4 = get_technique_CGL(xml);
  if (pXVar4 != (XMLElement *)0x0) {
    pXVar3 = pXVar4;
  }
  if (pXVar3 == (XMLElement *)0x0) goto LAB_00113639;
  pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,(char *)0x0);
  if (pXVar3 == (XMLElement *)0x0) {
    return;
  }
  pcVar5 = tinyxml2::XMLNode::Value(&pXVar3->super_XMLNode);
  std::__cxx11::string::string((string *)local_3d8,pcVar5,local_1b8);
  iVar1 = std::__cxx11::string::compare((char *)local_3d8);
  if (iVar1 == 0) {
    light->light_type = AMBIENT;
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"color","");
    pXVar3 = get_element(pXVar3,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (pXVar3 == (XMLElement *)0x0) goto LAB_00113639;
    pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
    std::__cxx11::string::string((string *)&local_408,pcVar5,local_1b8);
    puVar9 = local_1e8;
    local_1f8[0] = puVar9;
    std::__cxx11::string::_M_construct<char*>((string *)local_1f8,local_408,local_408 + local_400);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)local_1f8,_S_out|_S_in);
    std::istream::_M_extract<double>((double *)local_1b8);
    std::istream::_M_extract<double>((double *)local_1b8);
    std::istream::_M_extract<double>((double *)local_1b8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    (light->spectrum).field_0.field_0.x = 0.0;
    (light->spectrum).field_0.field_0.y = 0.0;
    (light->spectrum).field_0.field_0.z = 0.0;
    *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = uStack_410;
    puVar8 = local_1f8[0];
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_3d8);
    if (iVar1 == 0) {
      light->light_type = DIRECTIONAL;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"color","");
      pXVar3 = get_element(pXVar3,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if (pXVar3 == (XMLElement *)0x0) goto LAB_00113639;
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
      std::__cxx11::string::string((string *)&local_408,pcVar5,local_1b8);
      puVar9 = local_228;
      local_238[0] = puVar9;
      std::__cxx11::string::_M_construct<char*>((string *)local_238,local_408,local_408 + local_400)
      ;
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_1b8,(string *)local_238,_S_out|_S_in);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      (light->spectrum).field_0.field_0.x = 0.0;
      (light->spectrum).field_0.field_0.y = 0.0;
      (light->spectrum).field_0.field_0.z = 0.0;
      *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = uStack_410;
      puVar8 = local_238[0];
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_3d8);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)local_3d8);
        if (iVar1 == 0) {
          light->light_type = POINT;
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"color","");
          pXVar4 = get_element(pXVar3,&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b8,"constant_attenuation","");
          pXVar6 = get_element(pXVar3,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,"linear_attenuation","");
          pXVar7 = get_element(pXVar3,&local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p);
          }
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f8,"quadratic_attenuation","");
          pXVar3 = get_element(pXVar3,&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p);
          }
          if ((((pXVar4 == (XMLElement *)0x0) || (pXVar6 == (XMLElement *)0x0)) ||
              (pXVar7 == (XMLElement *)0x0)) || (pXVar3 == (XMLElement *)0x0)) goto LAB_00113639;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          std::__cxx11::string::string((string *)&local_408,pcVar5,local_1b8);
          local_318[0] = local_308;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_318,local_408,local_408 + local_400);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)local_318,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          (light->spectrum).field_0.field_0.x = 0.0;
          (light->spectrum).field_0.field_0.y = 0.0;
          (light->spectrum).field_0.field_0.z = 0.0;
          *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = uStack_410;
          if (local_318[0] != local_308) {
            operator_delete(local_318[0]);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          dVar10 = atof(pcVar5);
          light->constant_att = (float)dVar10;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar10 = atof(pcVar5);
          light->constant_att = (float)dVar10;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_3d8);
          if (iVar1 != 0) {
LAB_00113639:
            exit(1);
          }
          light->light_type = SPOT;
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"color","");
          local_3e0 = get_element(pXVar3,&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p);
          }
          pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"falloff_angle");
          pXVar6 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"falloff_exponent");
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_358,"constant_attenuation","");
          local_3e8 = get_element(pXVar3,&local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p);
          }
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_378,"linear_attenuation","");
          pXVar7 = get_element(pXVar3,&local_378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_398,"quadratic_attenuation","");
          pXVar3 = get_element(pXVar3,&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p);
          }
          if ((((local_3e0 == (XMLElement *)0x0) || (pXVar4 == (XMLElement *)0x0)) ||
              ((pXVar6 == (XMLElement *)0x0 ||
               ((local_3e8 == (XMLElement *)0x0 || (pXVar7 == (XMLElement *)0x0)))))) ||
             (pXVar3 == (XMLElement *)0x0)) goto LAB_00113639;
          pcVar5 = tinyxml2::XMLElement::GetText(local_3e0);
          std::__cxx11::string::string((string *)&local_408,pcVar5,local_1b8);
          local_3b8[0] = local_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3b8,local_408,local_408 + local_400);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)local_3b8,_S_out|_S_in);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::istream::_M_extract<double>((double *)local_1b8);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          (light->spectrum).field_0.field_0.x = 0.0;
          (light->spectrum).field_0.field_0.y = 0.0;
          (light->spectrum).field_0.field_0.z = 0.0;
          *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = uStack_410;
          if (local_3b8[0] != local_3a8) {
            operator_delete(local_3b8[0]);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          dVar10 = atof(pcVar5);
          light->constant_att = (float)dVar10;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          dVar10 = atof(pcVar5);
          light->constant_att = (float)dVar10;
          pcVar5 = tinyxml2::XMLElement::GetText(local_3e8);
          dVar10 = atof(pcVar5);
          light->constant_att = (float)dVar10;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar10 = atof(pcVar5);
          light->constant_att = (float)dVar10;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
        }
        dVar10 = atof(pcVar5);
        light->constant_att = (float)dVar10;
        goto LAB_001135f8;
      }
      light->light_type = AREA;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"color","");
      pXVar3 = get_element(pXVar3,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (pXVar3 == (XMLElement *)0x0) goto LAB_00113639;
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
      std::__cxx11::string::string((string *)&local_408,pcVar5,local_1b8);
      puVar9 = local_268;
      local_278[0] = puVar9;
      std::__cxx11::string::_M_construct<char*>((string *)local_278,local_408,local_408 + local_400)
      ;
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_1b8,(string *)local_278,_S_out|_S_in);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::istream::_M_extract<double>((double *)local_1b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      (light->spectrum).field_0.field_0.x = 0.0;
      (light->spectrum).field_0.field_0.y = 0.0;
      (light->spectrum).field_0.field_0.z = 0.0;
      *(undefined8 *)((long)&(light->spectrum).field_0 + 0x18) = uStack_410;
      puVar8 = local_278[0];
    }
  }
  if (puVar8 != puVar9) {
    operator_delete(puVar8);
  }
LAB_001135f8:
  if (local_408 != local_3f8) {
    operator_delete(local_408);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0]);
  }
  return;
}

Assistant:

void ColladaParser::parse_light( XMLElement* xml, LightInfo& light ) {

  // name & id
  light.id   = xml->Attribute( "id" );
  light.name = xml->Attribute("name");
  light.type = Instance::LIGHT;

  XMLElement* technique = NULL;
  XMLElement* technique_common = get_technique_common(xml);
  XMLElement* technique_CGL = get_technique_CGL(xml);

  technique = technique_CGL ? technique_CGL : technique_common;
  if (!technique) {
    stat("Error: No supported profile defined in light: " << light.id);
    exit(EXIT_FAILURE);
  }

  // light parameters
  XMLElement* e_light = technique->FirstChildElement();
  if (e_light) {

    // type
    string type = e_light->Name();

    // type-specific parameters
    if (type == "ambient") {
      light.light_type = LightType::AMBIENT;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in ambient light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "directional") {
      light.light_type = LightType::DIRECTIONAL;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in directional light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "area") {
      light.light_type = LightType::AREA;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
      } else {
        stat("Error: No color definition in area light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "point") {
      light.light_type = LightType::POINT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att = get_element(e_light, "quadratic_attenuation");
      if (e_color && e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of point light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "spot") {
      light.light_type = LightType::SPOT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_falloff_deg = e_light->FirstChildElement("falloff_angle");
      XMLElement* e_falloff_exp = e_light->FirstChildElement("falloff_exponent");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att = get_element(e_light, "quadratic_attenuation");
      if (e_color && e_falloff_deg && e_falloff_exp &&
          e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string( color_string );
        light.constant_att = atof(e_falloff_deg->GetText());
        light.constant_att = atof(e_falloff_exp->GetText());
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of spot light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else {
      stat("Error: Light type " << type << " in light: " << light.id << "is not supported");
      exit(EXIT_FAILURE);
    }

  }

  // print summary
  stat("  |- " << light);
}